

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

CTcCodeLabel * __thiscall
CTPNCodeBody::add_named_arg_tab(CTPNCodeBody *this,CTcNamedArgs *named_args)

{
  CTcNamedArgs *args;
  CTcNamedArgTab *in_RDI;
  CTcNamedArgTab *tab;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  
  args = (CTcNamedArgs *)operator_new((size_t)in_RDI,in_stack_ffffffffffffffd8);
  CTcNamedArgTab::CTcNamedArgTab(in_RDI,args);
  args[1].args = *(CTPNArglist **)&in_RDI[6].cnt;
  *(CTcNamedArgs **)&in_RDI[6].cnt = args;
  return *(CTcCodeLabel **)(args + 1);
}

Assistant:

CTcCodeLabel *CTPNCodeBody::add_named_arg_tab(const CTcNamedArgs *named_args)
{
    /* allocate the tracking object */
    CTcNamedArgTab *tab = new (G_prsmem) CTcNamedArgTab(named_args);

    /* link it into our list */
    tab->nxt = named_arg_tables_;
    named_arg_tables_ = tab;

    /* return the code label for the table */
    return tab->lbl;
}